

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::ktx_texture::init_2D
          (ktx_texture *this,uint width,uint height,uint num_mips,uint32 ogl_internal_fmt,
          uint32 ogl_fmt,uint32 ogl_type)

{
  bool bVar1;
  uint32 in_ECX;
  uint32 in_EDX;
  uint32 in_ESI;
  ktx_texture *in_RDI;
  uint32 in_R8D;
  uint32 in_R9D;
  uint32 in_stack_00000008;
  ktx_texture *in_stack_ffffffffffffffc8;
  
  clear(in_RDI);
  (in_RDI->m_header).m_pixelWidth = in_ESI;
  (in_RDI->m_header).m_pixelHeight = in_EDX;
  (in_RDI->m_header).m_numberOfMipmapLevels = in_ECX;
  (in_RDI->m_header).m_glInternalFormat = in_R8D;
  (in_RDI->m_header).m_glFormat = in_R9D;
  (in_RDI->m_header).m_glType = in_stack_00000008;
  (in_RDI->m_header).m_numberOfFaces = 1;
  bVar1 = compute_pixel_info(in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

bool ktx_texture::init_2D(uint width, uint height, uint num_mips, uint32 ogl_internal_fmt, uint32 ogl_fmt, uint32 ogl_type) {
  clear();

  m_header.m_pixelWidth = width;
  m_header.m_pixelHeight = height;
  m_header.m_numberOfMipmapLevels = num_mips;
  m_header.m_glInternalFormat = ogl_internal_fmt;
  m_header.m_glFormat = ogl_fmt;
  m_header.m_glType = ogl_type;
  m_header.m_numberOfFaces = 1;

  if (!compute_pixel_info())
    return false;

  return true;
}